

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highlighting.cpp
# Opt level: O2

vector<duckdb::highlightToken,_true> *
duckdb::Highlighting::Tokenize
          (vector<duckdb::highlightToken,_true> *__return_storage_ptr__,char *buf,size_t len,
          bool is_dot_command,searchMatch *match)

{
  reference pvVar1;
  ulong uVar2;
  undefined7 in_register_00000009;
  tokenType tVar3;
  pointer phVar4;
  size_type __n;
  long lVar5;
  ulong __n_00;
  value_type local_48;
  
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000009,is_dot_command) == 0) {
    GetParseTokens((vector<duckdb::highlightToken,_true> *)&local_48,buf,len);
  }
  else {
    GetDotCommandTokens((vector<duckdb::highlightToken,_true> *)&local_48,buf,len);
  }
  ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::_M_move_assign
            (&__return_storage_ptr__->
              super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
             &local_48);
  ::std::_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
  ~_Vector_base((_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                &local_48);
  if (match != (searchMatch *)0x0) {
    lVar5 = 0x18;
    for (__n = 0; __n_00 = __n + 1,
        __n_00 < (ulong)(((long)(__return_storage_ptr__->
                                super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                ).
                                super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->
                               super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                               ).
                               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18); __n = __n + 1) {
      pvVar1 = vector<duckdb::highlightToken,_true>::get<true>(__return_storage_ptr__,__n);
      if ((pvVar1->start <= match->match_start) &&
         (pvVar1 = vector<duckdb::highlightToken,_true>::get<true>(__return_storage_ptr__,__n_00),
         match->match_start <= pvVar1->start)) {
        pvVar1 = vector<duckdb::highlightToken,_true>::get<true>(__return_storage_ptr__,__n);
        tVar3 = pvVar1->type;
        pvVar1 = vector<duckdb::highlightToken,_true>::get<true>(__return_storage_ptr__,__n);
        if (pvVar1->start == match->match_start) {
          pvVar1 = vector<duckdb::highlightToken,_true>::get<true>(__return_storage_ptr__,__n);
          pvVar1->search_match = true;
        }
        else {
          pvVar1 = vector<duckdb::highlightToken,_true>::get<true>(__return_storage_ptr__,__n);
          local_48.type = pvVar1->type;
          local_48.start = match->match_start;
          local_48.search_match = true;
          ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::insert
                    (&__return_storage_ptr__->
                      super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                     (highlightToken *)
                     (&((__return_storage_ptr__->
                        super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ).
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_start)->type + lVar5),&local_48);
          __n_00 = __n + 2;
        }
        lVar5 = __n_00 * 0x18;
        goto LAB_001ed01f;
      }
      lVar5 = lVar5 + 0x18;
    }
  }
  return __return_storage_ptr__;
LAB_001ed01f:
  phVar4 = (__return_storage_ptr__->
           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(__return_storage_ptr__->
                 super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)phVar4) / 0x18;
  if (uVar2 <= __n_00) {
LAB_001ed07d:
    if (__n_00 < uVar2) {
      pvVar1 = vector<duckdb::highlightToken,_true>::get<true>(__return_storage_ptr__,__n_00);
      local_48.start = match->match_end;
      if (pvVar1->start <= local_48.start) {
        return __return_storage_ptr__;
      }
      phVar4 = (__return_storage_ptr__->
               super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      local_48.start = match->match_end;
    }
    local_48.search_match = false;
    local_48.type = tVar3;
    ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::insert
              (&__return_storage_ptr__->
                super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
               (highlightToken *)(&phVar4->type + lVar5),&local_48);
    return __return_storage_ptr__;
  }
  pvVar1 = vector<duckdb::highlightToken,_true>::get<true>(__return_storage_ptr__,__n_00);
  if (match->match_end <= pvVar1->start) {
    phVar4 = (__return_storage_ptr__->
             super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = ((long)(__return_storage_ptr__->
                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)phVar4) / 0x18;
    goto LAB_001ed07d;
  }
  pvVar1 = vector<duckdb::highlightToken,_true>::get<true>(__return_storage_ptr__,__n_00);
  tVar3 = pvVar1->type;
  pvVar1 = vector<duckdb::highlightToken,_true>::get<true>(__return_storage_ptr__,__n_00);
  pvVar1->search_match = true;
  __n_00 = __n_00 + 1;
  lVar5 = lVar5 + 0x18;
  goto LAB_001ed01f;
}

Assistant:

vector<highlightToken> Highlighting::Tokenize(char *buf, size_t len, bool is_dot_command, searchMatch *match) {
	vector<highlightToken> tokens;
	if (!is_dot_command) {
		// SQL query - use parser to obtain tokens
		tokens = GetParseTokens(buf, len);
	} else {
		// . command
		tokens = GetDotCommandTokens(buf, len);
	}
	if (match) {
		// we have a search match - insert it into the token list
		// we want to insert a search token with start = match_start, end = match_end
		// first figure out which token type we would have at match_end (if any)
		for (size_t i = 0; i + 1 < tokens.size(); i++) {
			if (tokens[i].start <= match->match_start && tokens[i + 1].start >= match->match_start) {
				// this token begins after the search position, insert the token here
				size_t token_position = i + 1;
				auto end_type = tokens[i].type;
				if (tokens[i].start == match->match_start) {
					// exact start: only set the search match
					tokens[i].search_match = true;
				} else {
					// non-exact start: add a new token
					highlightToken search_token;
					search_token.type = tokens[i].type;
					search_token.start = match->match_start;
					search_token.search_match = true;
					tokens.insert(tokens.begin() + token_position, search_token);
					token_position++;
				}

				// move forwards
				while (token_position < tokens.size() && tokens[token_position].start < match->match_end) {
					// this token is
					// mark this token as a search token
					end_type = tokens[token_position].type;
					tokens[token_position].search_match = true;
					token_position++;
				}
				if (token_position >= tokens.size() || tokens[token_position].start > match->match_end) {
					// insert the token that marks the end of the search
					highlightToken end_token;
					end_token.type = end_type;
					end_token.start = match->match_end;
					tokens.insert(tokens.begin() + token_position, end_token);
					token_position++;
				}
				break;
			}
		}
	}
	return tokens;
}